

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall testing::internal::SharedPayloadBase::Ref(SharedPayloadBase *this)

{
  SharedPayloadBase *this_local;
  
  LOCK();
  (this->ref).super___atomic_base<int>._M_i = (this->ref).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void Ref() { ref.fetch_add(1, std::memory_order_relaxed); }